

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O3

uint __thiscall
EnvironmentROBARM::GetHeurBasedonCoord(EnvironmentROBARM *this,unsigned_short *coord)

{
  unsigned_short endeffy;
  unsigned_short endeffx;
  double angles [6];
  undefined1 local_4c [2];
  undefined1 local_4a [2];
  undefined1 local_48 [56];
  
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x1c])
            (this,coord,local_48);
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x1e])
            (this,local_48,local_4a,local_4c);
  return 0;
}

Assistant:

unsigned int EnvironmentROBARM::GetHeurBasedonCoord(short unsigned int coord[NUMOFLINKS])
{
    short unsigned int endeffx, endeffy;
    double angles[NUMOFLINKS];
    unsigned int h;

    ComputeContAngles(coord, angles);
    ComputeEndEffectorPos(angles, &endeffx, &endeffy);

#if INFORMED
    h = HeurGrid[endeffx][endeffy];
#else
    h = 0;
#endif

    return h;
}